

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chrometracer.h
# Opt level: O2

void __thiscall CChromeTracer::~CChromeTracer(CChromeTracer *this)

{
  ostream *poVar1;
  
  flush(this);
  poVar1 = std::operator<<((ostream *)&this->m_TraceFile,
                           "{\"ph\":\"M\",\"name\":\"clintercept_eof\",\"pid\":");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,",\"tid\":0");
  poVar1 = std::operator<<(poVar1,"}\n");
  std::operator<<(poVar1,"]\n");
  std::ofstream::close();
  std::vector<CChromeTracer::Record,_std::allocator<CChromeTracer::Record>_>::~vector
            (&this->m_RecordBuffer);
  std::ofstream::~ofstream(&this->m_TraceFile);
  return;
}

Assistant:

~CChromeTracer()
    {
        flush();

        // Add an eof metadata event without a trailing comma to properly end
        // the json file.
        m_TraceFile
            << "{\"ph\":\"M\",\"name\":\"clintercept_eof\",\"pid\":" << m_ProcessId
            << ",\"tid\":0"
            << "}\n"
            << "]\n";
        m_TraceFile.close();
    }